

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simd_alignment_engine_implementation.hpp
# Opt level: O3

Alignment * __thiscall
spoa::SimdAlignmentEngine<(spoa::Architecture)3>::
Linear<spoa::InstructionSet<(spoa::Architecture)3,int>>
          (Alignment *__return_storage_ptr__,SimdAlignmentEngine<(spoa::Architecture)3> *this,
          uint32_t sequence_len,Graph *graph,int32_t *score)

{
  undefined8 *puVar1;
  uint *puVar2;
  type *ptVar3;
  AlignmentType AVar4;
  uint uVar5;
  __mxxxi *palVar6;
  __mxxxi *palVar7;
  byte bVar8;
  __mxxxi alVar9;
  undefined1 auVar10 [32];
  longlong lVar11;
  longlong lVar12;
  longlong lVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  uint32_t j_1;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  Implementation *pIVar20;
  pointer ppNVar21;
  pointer ppVar22;
  uint uVar23;
  pointer ppEVar24;
  pointer ppVar25;
  ulong uVar26;
  undefined4 uVar27;
  iterator __position;
  ulong uVar28;
  __mxxxi *palVar29;
  int iVar30;
  long lVar31;
  ulong uVar32;
  ulong uVar33;
  uint uVar34;
  __mxxxi *palVar35;
  ulong uVar36;
  long lVar37;
  Node *pNVar38;
  uint uVar39;
  pointer ppEVar40;
  bool bVar41;
  undefined1 auVar42 [16];
  undefined1 auVar45 [32];
  __mxxxi alVar43;
  undefined1 auVar44 [32];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  int iVar50;
  undefined1 auVar51 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [64];
  int32_t j;
  vector<unsigned_int,_std::allocator<unsigned_int>_> predecessors;
  vector<spoa::InstructionSet<(spoa::Architecture)3,_int>::Storage,_std::allocator<spoa::InstructionSet<(spoa::Architecture)3,_int>::Storage>_>
  backtrack_storage;
  type unpacked [8];
  uint local_150;
  uint local_14c;
  pointer local_148;
  ulong local_140;
  pointer local_138;
  type *local_130;
  Graph *local_128;
  vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *local_120;
  ulong local_118;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_110;
  type *local_f0;
  ulong local_e8;
  uint local_e0;
  uint local_dc;
  ulong local_d8;
  long local_d0;
  uint local_c4;
  __mxxxi local_c0;
  pointer local_88;
  longlong local_80;
  longlong lStack_78;
  longlong lStack_70;
  longlong lStack_68;
  
  auVar42 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,sequence_len);
  uVar18 = 0;
  uVar23 = 0;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = auVar42._0_8_ * 0.125;
  auVar42 = vroundsd_avx(auVar51,auVar51,10);
  uVar26 = vcvttsd2usi_avx512f(auVar42);
  local_80 = 0;
  lStack_78 = 0;
  lStack_70 = 0;
  lStack_68 = 0;
  do {
    *(undefined4 *)((long)&local_80 + uVar18 * 4) = 0x80000400;
    if (((uint)uVar18 + 1 & (uint)uVar18 & 0xfffffffe) == 0) {
      uVar28 = (ulong)uVar23;
      uVar23 = uVar23 + 1;
      palVar29 = ((this->pimpl_)._M_t.
                  super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  .
                  super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                 ._M_head_impl)->masks + uVar28;
      (*palVar29)[0] = local_80;
      (*palVar29)[1] = lStack_78;
      (*palVar29)[2] = lStack_70;
      (*palVar29)[3] = lStack_68;
    }
  } while ((uVar18 < 7) && (uVar18 = uVar18 + 1, uVar23 < 3));
  palVar29 = ((this->pimpl_)._M_t.
              super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
              ._M_t.
              super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
              .
              super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
             ._M_head_impl)->masks;
  palVar29[3][0] = -0x7ffffc0000000000;
  palVar29[3][1] = -0x7ffffbff7ffffc00;
  palVar29[3][2] = -0x7ffffbff7ffffc00;
  palVar29[3][3] = -0x7ffffbff7ffffc00;
  alVar43 = (__mxxxi)vpbroadcastd_avx512vl();
  *((this->pimpl_)._M_t.
    super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
    ._M_t.
    super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
    .
    super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
   ._M_head_impl)->penalties = alVar43;
  lVar19 = 0;
  do {
    palVar29 = ((this->pimpl_)._M_t.
                super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                ._M_t.
                super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                .
                super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
               ._M_head_impl)->penalties;
    auVar44 = *(undefined1 (*) [32])((long)*palVar29 + lVar19);
    auVar44 = vpaddd_avx2(auVar44,auVar44);
    *(undefined1 (*) [32])((long)palVar29[1] + lVar19) = auVar44;
    lVar19 = lVar19 + 0x20;
  } while (lVar19 != 0x40);
  ppNVar21 = (graph->rank_to_node_).
             super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_138 = (pointer)(graph->rank_to_node_).
                       super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
  if ((pointer)ppNVar21 == local_138) {
LAB_0010deb6:
    (__return_storage_ptr__->
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    return (Alignment *)
           (vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)__return_storage_ptr__;
  }
  auVar52._8_4_ = 0x80000400;
  auVar52._0_8_ = 0x8000040080000400;
  auVar52._12_4_ = 0x80000400;
  auVar52._16_4_ = 0x80000400;
  auVar52._20_4_ = 0x80000400;
  auVar52._24_4_ = 0x80000400;
  auVar52._28_4_ = 0x80000400;
  local_140 = (ulong)(sequence_len - 1);
  uVar18 = 0xffffffff;
  auVar44 = vpbroadcastd_avx512vl();
  local_118 = CONCAT44(local_118._4_4_,(int)(this->super_AlignmentEngine).g_);
  uVar27 = 0x80000400;
  if ((this->super_AlignmentEngine).type_ == kSW) {
    uVar27 = 0;
  }
  local_130 = (type *)(ulong)(sequence_len - 1 & 7);
  local_148 = (pointer)CONCAT44(local_148._4_4_,uVar27);
  do {
    pNVar38 = *ppNVar21;
    pIVar20 = (this->pimpl_)._M_t.
              super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
              ._M_t.
              super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
              .
              super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
              ._M_head_impl;
    lVar19 = *(long *)&(pIVar20->node_id_to_rank).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>;
    ppEVar40 = (pNVar38->inedges).
               super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    ppEVar24 = (pNVar38->inedges).
               super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>._M_impl
               .super__Vector_impl_data._M_finish;
    if (ppEVar40 == ppEVar24) {
      uVar28 = 0;
    }
    else {
      uVar28 = (ulong)(*(int *)(lVar19 + (ulong)(*ppEVar40)->tail->id * 4) + 1);
    }
    lVar37 = pNVar38->code * uVar26;
    palVar29 = pIVar20->H;
    palVar6 = pIVar20->sequence_profile;
    uVar23 = *(int *)(lVar19 + (ulong)pNVar38->id * 4) + 1;
    palVar35 = palVar29 + uVar23 * uVar26;
    if (uVar26 != 0) {
      lVar31 = uVar28 * uVar26;
      auVar55 = ZEXT464(*(uint *)(*(long *)&(pIVar20->first_column).
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl +
                                 uVar28 * 4));
      lVar19 = 0;
      uVar28 = uVar26;
      do {
        auVar45 = *(undefined1 (*) [32])((long)palVar29[lVar31] + lVar19);
        auVar54 = vperm2i128_avx2(auVar45,auVar45,0x28);
        auVar45 = vpalignr_avx2(auVar45,auVar54,0xc);
        auVar45 = vpor_avx2(auVar45,auVar55._0_32_);
        auVar42 = *(undefined1 (*) [16])((long)palVar29[lVar31] + lVar19 + 0x10);
        *(undefined1 (*) [32])((long)*palVar35 + lVar19) = auVar45;
        auVar45 = vpaddd_avx2(auVar45,*(undefined1 (*) [32])((long)palVar6[lVar37] + lVar19));
        auVar54 = vpaddd_avx2(auVar44,*(undefined1 (*) [32])((long)palVar29[lVar31] + lVar19));
        auVar53 = vpsrldq_avx2(ZEXT1632(auVar42),0xc);
        auVar55 = ZEXT3264(auVar53);
        auVar45 = vpmaxsd_avx2(auVar45,auVar54);
        *(undefined1 (*) [32])((long)*palVar35 + lVar19) = auVar45;
        lVar19 = lVar19 + 0x20;
        uVar28 = uVar28 - 1;
      } while (uVar28 != 0);
      pNVar38 = *ppNVar21;
      ppEVar40 = (pNVar38->inedges).
                 super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppEVar24 = (pNVar38->inedges).
                 super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
    }
    if (8 < (ulong)((long)ppEVar24 - (long)ppEVar40)) {
      uVar28 = 1;
      do {
        if (uVar26 != 0) {
          pIVar20 = (this->pimpl_)._M_t.
                    super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                    .
                    super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                    ._M_head_impl;
          uVar32 = (ulong)(*(int *)(*(long *)&(pIVar20->node_id_to_rank).
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                   + (ulong)ppEVar40[uVar28]->tail->id * 4) + 1);
          auVar55 = ZEXT464(*(uint *)(*(long *)&(pIVar20->first_column).
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl + uVar32 * 4));
          lVar19 = uVar32 * uVar26;
          palVar29 = pIVar20->H;
          lVar31 = 0;
          uVar32 = uVar26;
          do {
            auVar45 = *(undefined1 (*) [32])((long)palVar29[lVar19] + lVar31);
            auVar54 = vperm2i128_avx2(auVar45,auVar45,0x28);
            auVar54 = vpalignr_avx2(auVar45,auVar54,0xc);
            auVar45 = vpaddd_avx2(auVar44,auVar45);
            auVar54 = vpor_avx2(auVar54,auVar55._0_32_);
            auVar54 = vpaddd_avx2(auVar54,*(undefined1 (*) [32])((long)palVar6[lVar37] + lVar31));
            auVar45 = vpmaxsd_avx2(auVar54,auVar45);
            auVar45 = vpmaxsd_avx2(auVar45,*(undefined1 (*) [32])((long)*palVar35 + lVar31));
            auVar54 = vpsrldq_avx2(ZEXT1632(*(undefined1 (*) [16])
                                             ((long)palVar29[lVar19] + lVar31 + 0x10)),0xc);
            auVar55 = ZEXT3264(auVar54);
            *(undefined1 (*) [32])((long)*palVar35 + lVar31) = auVar45;
            lVar31 = lVar31 + 0x20;
            uVar32 = uVar32 - 1;
          } while (uVar32 != 0);
          pNVar38 = *ppNVar21;
        }
        ppEVar40 = (pNVar38->inedges).
                   super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        uVar28 = (ulong)((int)uVar28 + 1);
      } while (uVar28 < (ulong)((long)(pNVar38->inedges).
                                      super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar40 >>
                               3));
    }
    auVar54 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    auVar45 = auVar52;
    if (uVar26 != 0) {
      auVar42 = vpbroadcastd_avx512vl();
      auVar55 = ZEXT1264(CONCAT84(SUB128(ZEXT812(0),4),auVar42._0_4_));
      palVar29 = palVar35;
      uVar28 = uVar26;
      do {
        auVar53 = vorps_avx(auVar55._0_32_,
                            (undefined1  [32])
                            ((this->pimpl_)._M_t.
                             super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                             .
                             super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                            ._M_head_impl)->masks[3]);
        alVar43 = (__mxxxi)vpmaxsd_avx2(auVar53,(undefined1  [32])*palVar29);
        *palVar29 = alVar43;
        pIVar20 = (this->pimpl_)._M_t.
                  super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  .
                  super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                  ._M_head_impl;
        palVar6 = pIVar20->masks;
        palVar7 = pIVar20->penalties;
        auVar53 = vpaddd_avx2((undefined1  [32])alVar43,(undefined1  [32])*palVar7);
        auVar10 = vperm2i128_avx2(auVar53,auVar53,0x28);
        auVar53 = vpalignr_avx2(auVar53,auVar10,0xc);
        auVar53 = vpor_avx2(auVar53,(undefined1  [32])*palVar6);
        alVar43 = (__mxxxi)vpmaxsd_avx2((undefined1  [32])alVar43,auVar53);
        *palVar29 = alVar43;
        auVar53 = vpaddd_avx2((undefined1  [32])alVar43,(undefined1  [32])palVar7[1]);
        auVar53 = valignq_avx512vl(auVar53,auVar54,3);
        auVar53 = vpor_avx2(auVar53,(undefined1  [32])palVar6[1]);
        alVar43 = (__mxxxi)vpmaxsd_avx2((undefined1  [32])alVar43,auVar53);
        *palVar29 = alVar43;
        auVar53 = vpaddd_avx2((undefined1  [32])alVar43,(undefined1  [32])palVar7[2]);
        auVar53 = vperm2i128_avx2(auVar53,auVar53,0x28);
        auVar53 = vpor_avx2(auVar53,(undefined1  [32])palVar6[2]);
        alVar43 = (__mxxxi)vpmaxsd_avx2((undefined1  [32])alVar43,auVar53);
        *palVar29 = alVar43;
        alVar9 = alVar43;
        if ((this->super_AlignmentEngine).type_ == kSW) {
          alVar9 = (__mxxxi)vpmaxsd_avx2((undefined1  [32])alVar43,auVar54);
          *palVar29 = alVar9;
        }
        palVar29 = palVar29 + 1;
        auVar45 = vpmaxsd_avx2(auVar45,(undefined1  [32])alVar9);
        uVar28 = uVar28 - 1;
        auVar42 = vpaddd_avx(alVar43._16_16_,auVar44._16_16_);
        auVar53 = vpsrldq_avx2(ZEXT1632(auVar42),0xc);
        auVar55 = ZEXT3264(auVar53);
      } while (uVar28 != 0);
    }
    AVar4 = (this->super_AlignmentEngine).type_;
    if (AVar4 == kSW) {
LAB_0010dd9b:
      auVar45 = vpmaxsd_avx2(auVar45,auVar54);
      auVar42 = vpmaxsd_avx(auVar45._0_16_,auVar45._16_16_);
      auVar51 = vpshufd_avx(auVar42,0xee);
      auVar42 = vpmaxsd_avx(auVar42,auVar51);
      auVar51 = vpshufd_avx(auVar42,0x55);
      auVar42 = vpmaxsd_avx(auVar42,auVar51);
      iVar30 = auVar42._0_4_;
LAB_0010ddf5:
      if ((int)local_148 < iVar30) {
        uVar18 = (ulong)uVar23;
      }
      iVar50 = (int)local_148;
      if ((int)local_148 <= iVar30) {
        iVar50 = iVar30;
      }
      local_148 = (pointer)CONCAT44(local_148._4_4_,iVar50);
    }
    else if (AVar4 == kNW) {
      if (((*ppNVar21)->outedges).
          super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>._M_impl.
          super__Vector_impl_data._M_start ==
          ((*ppNVar21)->outedges).
          super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        local_c0 = palVar35[uVar26 - 1];
        iVar30 = *(int *)((long)local_c0 + (long)local_130 * 4);
        goto LAB_0010ddf5;
      }
    }
    else if ((AVar4 == kOV) &&
            (((*ppNVar21)->outedges).
             super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>._M_impl.
             super__Vector_impl_data._M_start ==
             ((*ppNVar21)->outedges).
             super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>._M_impl.
             super__Vector_impl_data._M_finish)) goto LAB_0010dd9b;
    ppNVar21 = ppNVar21 + 1;
  } while ((pointer)ppNVar21 != local_138);
  iVar30 = (int)uVar18;
  if (iVar30 == -1) goto LAB_0010deb6;
  if (score != (int32_t *)0x0) {
    *score = (int)local_148;
  }
  if (AVar4 == kOV) {
    pNVar38 = (graph->rank_to_node_).
              super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
              super__Vector_impl_data._M_start[(long)iVar30 + -1];
    if ((pNVar38->outedges).
        super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        *(pointer *)
         ((long)&(pNVar38->outedges).
                 super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                 _M_impl + 8)) goto LAB_0010df56;
    if ((uVar26 & 0xffffffff) != 0) {
      uVar28 = 0;
      iVar50 = 0;
      do {
        lVar19 = 0;
        local_c0 = ((this->pimpl_)._M_t.
                    super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                    .
                    super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                   ._M_head_impl)->H[(long)iVar30 * uVar26 + uVar28];
        do {
          if (*(int *)((long)local_c0 + lVar19 * 4) == (int)local_148) goto LAB_0010df4f;
          lVar19 = lVar19 + 1;
        } while (lVar19 != 8);
        uVar28 = uVar28 + 1;
        iVar50 = iVar50 + -8;
      } while (uVar28 != (uVar26 & 0xffffffff));
    }
  }
  else {
    if (AVar4 == kNW) goto LAB_0010df56;
    if ((AVar4 == kSW) && ((uVar26 & 0xffffffff) != 0)) {
      uVar28 = 0;
      iVar50 = 0;
      do {
        lVar19 = 0;
        local_c0 = ((this->pimpl_)._M_t.
                    super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                    .
                    super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                   ._M_head_impl)->H[(long)iVar30 * uVar26 + uVar28];
        do {
          if (*(int *)((long)local_c0 + lVar19 * 4) == (int)local_148) goto LAB_0010df4f;
          lVar19 = lVar19 + 1;
        } while (lVar19 != 8);
        uVar28 = uVar28 + 1;
        iVar50 = iVar50 + -8;
      } while (uVar28 != (uVar26 & 0xffffffff));
    }
  }
  local_140 = 0xffffffff;
LAB_0010df56:
  if (iVar30 == 0) {
    iVar50 = 1;
  }
  else {
    auVar44._8_4_ = 1;
    auVar44._0_8_ = 0x100000001;
    auVar44._12_4_ = 1;
    auVar44._16_4_ = 1;
    auVar44._20_4_ = 1;
    auVar44._24_4_ = 1;
    auVar44._28_4_ = 1;
    auVar55 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar46 = vpbroadcastq_avx512f();
    uVar28 = 0;
    do {
      auVar52 = auVar44;
      auVar47 = vpbroadcastq_avx512f();
      auVar47 = vporq_avx512f(auVar47,auVar55);
      uVar32 = vpcmpuq_avx512f(auVar47,auVar46,2);
      vmovdqu64_avx512f(*(undefined1 (*) [64])
                         ((graph->rank_to_node_).
                          super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar28));
      uVar28 = uVar28 + 8;
      auVar47 = vpgatherqq_avx512f(*(undefined8 *)(uVar26 + 0x10));
      bVar8 = (byte)uVar32;
      auVar48._8_8_ = (ulong)((byte)(uVar32 >> 1) & 1) * auVar47._8_8_;
      auVar48._0_8_ = (ulong)(bVar8 & 1) * auVar47._0_8_;
      auVar48._16_8_ = (ulong)((byte)(uVar32 >> 2) & 1) * auVar47._16_8_;
      auVar48._24_8_ = (ulong)((byte)(uVar32 >> 3) & 1) * auVar47._24_8_;
      auVar48._32_8_ = (ulong)((byte)(uVar32 >> 4) & 1) * auVar47._32_8_;
      auVar48._40_8_ = (ulong)((byte)(uVar32 >> 5) & 1) * auVar47._40_8_;
      auVar48._48_8_ = (ulong)((byte)(uVar32 >> 6) & 1) * auVar47._48_8_;
      auVar48._56_8_ = (uVar32 >> 7) * auVar47._56_8_;
      auVar47 = vpgatherqq_avx512f(*(undefined8 *)(uVar26 + 8));
      auVar49._8_8_ = (ulong)((byte)(uVar32 >> 1) & 1) * auVar47._8_8_;
      auVar49._0_8_ = (ulong)(bVar8 & 1) * auVar47._0_8_;
      auVar49._16_8_ = (ulong)((byte)(uVar32 >> 2) & 1) * auVar47._16_8_;
      auVar49._24_8_ = (ulong)((byte)(uVar32 >> 3) & 1) * auVar47._24_8_;
      auVar49._32_8_ = (ulong)((byte)(uVar32 >> 4) & 1) * auVar47._32_8_;
      auVar49._40_8_ = (ulong)((byte)(uVar32 >> 5) & 1) * auVar47._40_8_;
      auVar49._48_8_ = (ulong)((byte)(uVar32 >> 6) & 1) * auVar47._48_8_;
      auVar49._56_8_ = (uVar32 >> 7) * auVar47._56_8_;
      auVar47 = vpsubq_avx512f(auVar48,auVar49);
      auVar47 = vpsrlq_avx512f(auVar47,3);
      auVar44 = vpmovqd_avx512f(auVar47);
      auVar44 = vpmaxud_avx2(auVar52,auVar44);
    } while ((uVar18 + 7 & 0xfffffffffffffff8) != uVar28);
    auVar44 = vmovdqa32_avx512vl(auVar44);
    auVar42._0_4_ = (uint)(bVar8 & 1) * auVar44._0_4_ | (uint)!(bool)(bVar8 & 1) * auVar52._0_4_;
    bVar41 = (bool)((byte)(uVar32 >> 1) & 1);
    auVar42._4_4_ = (uint)bVar41 * auVar44._4_4_ | (uint)!bVar41 * auVar52._4_4_;
    bVar41 = (bool)((byte)(uVar32 >> 2) & 1);
    auVar42._8_4_ = (uint)bVar41 * auVar44._8_4_ | (uint)!bVar41 * auVar52._8_4_;
    bVar41 = (bool)((byte)(uVar32 >> 3) & 1);
    auVar42._12_4_ = (uint)bVar41 * auVar44._12_4_ | (uint)!bVar41 * auVar52._12_4_;
    bVar41 = (bool)((byte)(uVar32 >> 4) & 1);
    auVar45._16_4_ = (uint)bVar41 * auVar44._16_4_ | (uint)!bVar41 * auVar52._16_4_;
    auVar45._0_16_ = auVar42;
    bVar41 = (bool)((byte)(uVar32 >> 5) & 1);
    auVar45._20_4_ = (uint)bVar41 * auVar44._20_4_ | (uint)!bVar41 * auVar52._20_4_;
    bVar41 = (bool)((byte)(uVar32 >> 6) & 1);
    auVar45._24_4_ = (uint)bVar41 * auVar44._24_4_ | (uint)!bVar41 * auVar52._24_4_;
    bVar41 = SUB81(uVar32 >> 7,0);
    auVar45._28_4_ = (uint)bVar41 * auVar44._28_4_ | (uint)!bVar41 * auVar52._28_4_;
    auVar42 = vpmaxud_avx(auVar42,auVar45._16_16_);
    auVar51 = vpshufd_avx(auVar42,0xee);
    auVar42 = vpmaxud_avx(auVar42,auVar51);
    auVar51 = vpshufd_avx(auVar42,0x55);
    auVar42 = vpmaxud_avx(auVar42,auVar51);
    iVar50 = auVar42._0_4_;
  }
  local_128 = graph;
  local_120 = (vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
              __return_storage_ptr__;
  local_f0 = score;
  std::
  vector<spoa::InstructionSet<(spoa::Architecture)3,_int>::Storage,_std::allocator<spoa::InstructionSet<(spoa::Architecture)3,_int>::Storage>_>
  ::vector((vector<spoa::InstructionSet<(spoa::Architecture)3,_int>::Storage,_std::allocator<spoa::InstructionSet<(spoa::Architecture)3,_int>::Storage>_>
            *)local_c0,(ulong)(iVar50 * 0x10 + 0x18),(allocator_type *)&local_110);
  local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138 = (pointer)local_c0[0];
  local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  local_14c = (uint)local_140;
  *(pointer *)(local_120 + 0x10) = (pointer)0x0;
  *(undefined1 (*) [16])local_120 = (undefined1  [16])0x0;
  if ((local_14c == 0xffffffff) || (iVar30 == 0)) {
LAB_0010e5b7:
    uVar23 = (uint)uVar18;
  }
  else {
    local_e8 = 0;
    uVar23 = 0;
    local_148 = (pointer)(local_c0[0] + 0x20);
    local_f0 = ((pointer)(local_c0[0] + 0x20))->arr + (uint)(iVar50 << 3);
    local_130 = local_f0 + (uint)(iVar50 << 3);
    bVar41 = true;
    uVar28 = local_140;
    do {
      local_e0 = (uint)(uVar28 >> 3) & 0x1fffffff;
      local_d0 = (long)((int)uVar18 + -1);
      local_140 = uVar28;
      local_dc = uVar23;
      local_d8 = uVar18;
      if (bVar41) {
        __position._M_current =
             local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start) {
          local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
          __position._M_current =
               local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
        }
        local_118 = (ulong)local_e0 * 0x20;
        local_88 = (local_128->rank_to_node_).
                   super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        palVar29 = ((this->pimpl_)._M_t.
                    super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                    .
                    super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                   ._M_head_impl)->H + (long)(int)uVar18 * uVar26 + (ulong)local_e0;
        lVar11 = (*palVar29)[1];
        lVar12 = (*palVar29)[2];
        lVar13 = (*palVar29)[3];
        *(longlong *)local_138->arr = (*palVar29)[0];
        *(longlong *)(local_138->arr + 2) = lVar11;
        *(longlong *)(local_138->arr + 4) = lVar12;
        *(longlong *)(local_138->arr + 6) = lVar13;
        ppEVar24 = (local_88[local_d0]->inedges).
                   super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppEVar40 = *(pointer *)
                    ((long)&(local_88[local_d0]->inedges).
                            super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                            ._M_impl + 8);
        if (ppEVar24 == ppEVar40) {
          local_150 = 0;
          if (__position._M_current ==
              local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<int>
                      (&local_110,__position,(int *)&local_150);
          }
          else {
            *__position._M_current = 0;
            local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
          puVar1 = (undefined8 *)
                   ((long)*((this->pimpl_)._M_t.
                            super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                            .
                            super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                           ._M_head_impl)->H + local_118);
          uVar14 = puVar1[1];
          uVar15 = puVar1[2];
          uVar16 = puVar1[3];
          *(undefined8 *)local_148->arr = *puVar1;
          *(undefined8 *)(local_148->arr + 2) = uVar14;
          *(undefined8 *)(local_148->arr + 4) = uVar15;
          *(undefined8 *)(local_148->arr + 6) = uVar16;
        }
        else {
          uVar18 = 0;
          do {
            pIVar20 = (this->pimpl_)._M_t.
                      super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                      .
                      super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                      ._M_head_impl;
            local_150 = *(int *)(*(long *)&(pIVar20->node_id_to_rank).
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                + (ulong)*(uint *)**(undefined8 **)((long)ppEVar24 + uVar18) * 4) +
                        1;
            if (__position._M_current ==
                local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>(&local_110,__position,&local_150);
              pIVar20 = (this->pimpl_)._M_t.
                        super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                        .
                        super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                        ._M_head_impl;
              __position._M_current =
                   local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_finish;
            }
            else {
              *__position._M_current = local_150;
              local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish = __position._M_current + 1;
              __position._M_current = __position._M_current + 1;
            }
            puVar1 = (undefined8 *)
                     ((long)pIVar20->H[__position._M_current[-1] * uVar26] + local_118);
            uVar14 = puVar1[1];
            uVar15 = puVar1[2];
            uVar16 = puVar1[3];
            ptVar3 = local_148->arr + (uVar18 & 0xffffffff);
            *(undefined8 *)ptVar3 = *puVar1;
            *(undefined8 *)(ptVar3 + 2) = uVar14;
            *(undefined8 *)(ptVar3 + 4) = uVar15;
            *(undefined8 *)(ptVar3 + 6) = uVar16;
            lVar19 = uVar18 + 8;
            uVar18 = uVar18 + 8;
          } while ((pointer)((long)ppEVar24 + lVar19) != ppEVar40);
        }
        puVar1 = (undefined8 *)
                 ((long)((this->pimpl_)._M_t.
                         super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                         .
                         super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                        ._M_head_impl)->sequence_profile[local_88[local_d0]->code * uVar26] +
                 local_118);
        uVar14 = puVar1[1];
        uVar15 = puVar1[2];
        uVar16 = puVar1[3];
        *(undefined8 *)(local_130 + 8) = *puVar1;
        *(undefined8 *)(local_130 + 10) = uVar14;
        *(undefined8 *)(local_130 + 0xc) = uVar15;
        *(undefined8 *)(local_130 + 0xe) = uVar16;
      }
      uVar34 = local_14c;
      uVar17 = (uint)local_140 & 7;
      if (((this->super_AlignmentEngine).type_ == kSW) &&
         (uVar18 = local_d8, local_138->arr[uVar17] == 0)) goto LAB_0010e5b7;
      uVar5 = (uint)local_d8;
      if ((local_140 & 7) == 0) {
        pIVar20 = (this->pimpl_)._M_t.
                  super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  .
                  super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                  ._M_head_impl;
        if ((uint)local_140 < 8) {
          lVar19 = *(long *)&(pIVar20->first_column).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl;
          local_130[7] = *(int32_t *)(lVar19 + (long)(int)uVar5 * 4);
          uVar18 = (long)local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 2;
          if (local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start) {
            uVar32 = 0;
            uVar28 = 7;
            do {
              puVar2 = local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start + uVar32;
              uVar32 = uVar32 + 1;
              local_f0[uVar28] = *(int32_t *)(lVar19 + (ulong)*puVar2 * 4);
              uVar28 = (ulong)((int)uVar28 + 8);
            } while ((uVar32 & 0xffffffff) < uVar18);
          }
        }
        else {
          palVar29 = pIVar20->H + (long)(int)uVar5 * uVar26 + ((ulong)local_e0 - 1);
          lVar11 = *(longlong *)((long)*palVar29 + 8);
          lVar12 = *(longlong *)((long)*palVar29 + 0x10);
          lVar13 = *(longlong *)((long)*palVar29 + 0x18);
          *(longlong *)local_130 = (*palVar29)[0];
          *(longlong *)(local_130 + 2) = lVar11;
          *(longlong *)(local_130 + 4) = lVar12;
          *(longlong *)(local_130 + 6) = lVar13;
          uVar18 = (long)local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 2;
          if (local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start) {
            uVar32 = 0;
            uVar28 = 0;
            do {
              puVar2 = local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start + uVar32;
              uVar32 = uVar32 + 1;
              palVar29 = ((this->pimpl_)._M_t.
                          super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                          .
                          super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                         ._M_head_impl)->H + *puVar2 * uVar26 + ((ulong)local_e0 - 1);
              lVar11 = *(longlong *)((long)*palVar29 + 8);
              lVar12 = *(longlong *)((long)*palVar29 + 0x10);
              lVar13 = *(longlong *)((long)*palVar29 + 0x18);
              ptVar3 = local_f0 + uVar28;
              *(longlong *)ptVar3 = (*palVar29)[0];
              *(longlong *)(ptVar3 + 2) = lVar11;
              *(longlong *)(ptVar3 + 4) = lVar12;
              *(longlong *)(ptVar3 + 6) = lVar13;
              uVar28 = (ulong)((int)uVar28 + 8);
            } while ((uVar32 & 0xffffffff) < uVar18);
          }
        }
      }
      else {
        uVar18 = (long)local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 2;
      }
      if (local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start) {
LAB_0010e4df:
        uVar23 = local_dc;
        uVar39 = uVar5;
        if ((local_140 & 7) == 0) {
          if (local_138->arr[0] == (int)(this->super_AlignmentEngine).g_ + local_130[7])
          goto LAB_0010e517;
        }
        else if (local_138->arr[uVar17] ==
                 (int)(this->super_AlignmentEngine).g_ + local_138->arr[(ulong)uVar17 - 1]) {
LAB_0010e517:
          uVar23 = local_14c - 1;
          goto LAB_0010e519;
        }
      }
      else {
        local_118 = (ulong)uVar17;
        uVar23 = uVar17 - 1;
        uVar36 = 7;
        uVar28 = 1;
        uVar32 = 0;
        do {
          uVar33 = uVar28;
          if ((local_140 & 7) == 0) {
            if (local_138->arr[0] == local_130[8] + local_f0[uVar36]) goto LAB_0010e40e;
          }
          else if (*(int *)((long)local_138->arr + (ulong)(uVar17 * 4)) ==
                   *(int *)((long)local_130 + (ulong)(uVar17 * 4) + 0x20) + local_138[1].arr[uVar23]
                  ) {
LAB_0010e40e:
            uVar39 = local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar32];
            goto LAB_0010e517;
          }
          uVar23 = uVar23 + 8;
          uVar36 = (ulong)((int)uVar36 + 8);
          uVar28 = (ulong)((int)uVar33 + 1);
          uVar32 = uVar33;
        } while (uVar33 < uVar18);
        if (local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start) goto LAB_0010e4df;
        iVar30 = (int)(this->super_AlignmentEngine).g_;
        if (local_138->arr[local_118] == local_138[1].arr[local_118] + iVar30) {
          uVar32 = 0;
        }
        else {
          uVar28 = 1;
          uVar23 = uVar17;
          do {
            uVar32 = uVar28;
            uVar23 = uVar23 + 8;
            if (uVar18 <= uVar32) goto LAB_0010e4df;
            uVar28 = (ulong)((int)uVar32 + 1);
          } while (local_138->arr[local_118] != local_148->arr[uVar23] + iVar30);
        }
        uVar39 = local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar32];
        uVar23 = local_14c;
LAB_0010e519:
        local_e8 = (ulong)uVar23;
        uVar23 = uVar39;
      }
      local_150 = 0xffffffff;
      if (uVar5 != uVar23) {
        local_150 = (local_128->rank_to_node_).
                    super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                    _M_impl.super__Vector_impl_data._M_start[local_d0]->id;
      }
      local_c4 = local_14c;
      if (local_14c == (uint)local_e8) {
        local_c4 = 0xffffffff;
      }
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
      emplace_back<unsigned_int,int>(local_120,&local_150,(int *)&local_c4);
      bVar41 = true;
      local_14c = (uint)local_e8;
      if (uVar5 == uVar23) {
        bVar41 = (~local_14c & 7) == 0 && uVar34 != local_14c;
      }
      if (local_14c == 0xffffffff) break;
      uVar28 = local_e8 & 0xffffffff;
      uVar18 = (ulong)uVar23;
    } while (uVar23 != 0);
  }
  if ((this->super_AlignmentEngine).type_ == kNW) {
    uVar34 = local_14c;
    if (local_14c != 0xffffffff && uVar23 == 0) {
      do {
        local_150 = 0xffffffff;
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int,int&>
                  (local_120,(int *)&local_150,(int *)&local_14c);
        bVar41 = local_14c != 0;
        local_14c = local_14c - 1;
      } while (bVar41);
      uVar34 = 0xffffffff;
    }
    if (uVar34 == 0xffffffff && uVar23 != 0) {
      ppNVar21 = (local_128->rank_to_node_).
                 super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      while( true ) {
        lVar19 = (long)(int)uVar23;
        local_150 = 0xffffffff;
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
        emplace_back<unsigned_int&,int>(local_120,&ppNVar21[lVar19 + -1]->id,(int *)&local_150);
        ppNVar21 = (local_128->rank_to_node_).
                   super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppEVar24 = (ppNVar21[lVar19 + -1]->inedges).
                   super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppEVar40 = *(pointer *)
                    ((long)&(ppNVar21[lVar19 + -1]->inedges).
                            super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                            ._M_impl + 8);
        if (ppEVar24 == ppEVar40) break;
        pIVar20 = (this->pimpl_)._M_t.
                  super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  .
                  super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                  ._M_head_impl;
        lVar37 = *(long *)&(pIVar20->first_column).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl;
        do {
          uVar34 = *(int *)(*(long *)&(pIVar20->node_id_to_rank).
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           + (ulong)(*ppEVar24)->tail->id * 4) + 1;
          if (*(int *)(lVar37 + lVar19 * 4) ==
              *(int *)(lVar37 + (ulong)uVar34 * 4) + (int)(this->super_AlignmentEngine).g_) break;
          ppEVar24 = ppEVar24 + 1;
          uVar34 = uVar23;
        } while (ppEVar24 != ppEVar40);
        uVar23 = uVar34;
        if ((uVar23 == 0) || (local_14c != 0xffffffff)) break;
      }
    }
  }
  ppVar22 = *(pointer *)local_120;
  ppVar25 = *(pointer *)(local_120 + 8) + -1;
  if (ppVar22 < ppVar25 && ppVar22 != *(pointer *)(local_120 + 8)) {
    do {
      iVar30 = ppVar22->first;
      ppVar22->first = ppVar25->first;
      ppVar25->first = iVar30;
      iVar30 = ppVar22->second;
      ppVar22->second = ppVar25->second;
      ppVar25->second = iVar30;
      ppVar22 = ppVar22 + 1;
      ppVar25 = ppVar25 + -1;
    } while (ppVar22 < ppVar25);
  }
  if (local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((pointer)local_c0[0] == (pointer)0x0) {
    return (Alignment *)local_120;
  }
  operator_delete((void *)local_c0[0],local_c0[2] - local_c0[0],0x20);
  return (Alignment *)local_120;
LAB_0010df4f:
  local_140 = (ulong)(uint)((int)lVar19 - iVar50);
  goto LAB_0010df56;
}

Assistant:

Alignment SimdAlignmentEngine<A>::Linear(
    std::uint32_t sequence_len,
    const Graph& graph,
    std::int32_t* score) noexcept {
#if defined(__AVX2__) || defined(__SSE4_1__) || defined(SPOA_USE_SIMDE)
  std::uint64_t normal_matrix_width = sequence_len;
  std::uint64_t matrix_width =
      std::ceil(static_cast<double>(sequence_len) / T::kNumVar);
  const auto& rank_to_node = graph.rank_to_node();

  typename T::type kNegativeInfinity =
      std::numeric_limits<typename T::type>::min() + 1024;

  __attribute__((aligned(kRegisterSize / 8))) typename T::type unpacked[T::kNumVar] = {0};  // NOLINT

  for (std::uint32_t i = 0, j = 0; i < T::kNumVar && j < T::kLogNumVar; ++i) {
    unpacked[i] = kNegativeInfinity;
    if ((i & (i + 1)) == 0) {
      pimpl_->masks[j++] = _mmxxx_load_si(
        reinterpret_cast<const __mxxxi*>(unpacked));
    }
  }
  pimpl_->masks[T::kLogNumVar] = _mmxxx_slli_si(
      T::_mmxxx_set1_epi(kNegativeInfinity),
      T::kLSS);

  pimpl_->penalties[0] = T::_mmxxx_set1_epi(g_);
  for (std::uint32_t i = 1; i < T::kLogNumVar; ++i) {
    pimpl_->penalties[i] = T::_mmxxx_add_epi(
        pimpl_->penalties[i - 1],
        pimpl_->penalties[i - 1]);
  }

  typename T::type max_score = type_ == AlignmentType::kSW ? 0 : kNegativeInfinity;  // NOLINT
  std::int32_t max_i = -1;
  std::int32_t max_j = -1;
  std::uint32_t last_column_id = (normal_matrix_width - 1) % T::kNumVar;
  __mxxxi zeroes = T::_mmxxx_set1_epi(0);
  __mxxxi g = T::_mmxxx_set1_epi(g_);

  // alignment
  for (const auto& it : rank_to_node) {
    __mxxxi* char_profile = &(pimpl_->sequence_profile[it->code * matrix_width]);  // NOLINT

    std::uint32_t i = pimpl_->node_id_to_rank[it->id] + 1;
    std::uint32_t pred_i = it->inedges.empty() ?
        0 : pimpl_->node_id_to_rank[it->inedges[0]->tail->id] + 1;

    __mxxxi* H_row = &(pimpl_->H[i * matrix_width]);
    __mxxxi* H_pred_row = &(pimpl_->H[pred_i * matrix_width]);

    __mxxxi x = _mmxxx_srli_si(
        T::_mmxxx_set1_epi(pimpl_->first_column[pred_i]),
        T::kRSS);

    for (std::uint64_t j = 0; j < matrix_width; ++j) {
      // get diagonal
      __mxxxi t1 = _mmxxx_srli_si(H_pred_row[j], T::kRSS);
      H_row[j] = _mmxxx_or_si(
          _mmxxx_slli_si(H_pred_row[j], T::kLSS),
          x);
      x = t1;

      // update M
      H_row[j] = T::_mmxxx_max_epi(
          T::_mmxxx_add_epi(H_row[j], char_profile[j]),
          T::_mmxxx_add_epi(H_pred_row[j], g));
    }
    // check other predecessors
    for (std::uint32_t p = 1; p < it->inedges.size(); ++p) {
      pred_i = pimpl_->node_id_to_rank[it->inedges[p]->tail->id] + 1;

      H_pred_row = &(pimpl_->H[pred_i * matrix_width]);

      x = _mmxxx_srli_si(
          T::_mmxxx_set1_epi(pimpl_->first_column[pred_i]),
          T::kRSS);

      for (std::uint64_t j = 0; j < matrix_width; ++j) {
        // get diagonal
        __mxxxi t1 = _mmxxx_srli_si(H_pred_row[j], T::kRSS);
        __mxxxi m = _mmxxx_or_si(
            _mmxxx_slli_si(H_pred_row[j], T::kLSS),
            x);
        x = t1;

        // updage M
        H_row[j] = T::_mmxxx_max_epi(
            H_row[j],
            T::_mmxxx_max_epi(
                T::_mmxxx_add_epi(m, char_profile[j]),
                T::_mmxxx_add_epi(H_pred_row[j], g)));
      }
    }

    __mxxxi score = T::_mmxxx_set1_epi(kNegativeInfinity);
    x = _mmxxx_srli_si(
        T::_mmxxx_add_epi(
            T::_mmxxx_set1_epi(pimpl_->first_column[i]),
            g),
        T::kRSS);

    for (std::uint64_t j = 0; j < matrix_width; ++j) {
      // add last element of previous vector into this one
      H_row[j] = T::_mmxxx_max_epi(
          H_row[j],
          _mmxxx_or_si(x, pimpl_->masks[T::kLogNumVar]));

      T::_mmxxx_prefix_max(H_row[j], pimpl_->masks, pimpl_->penalties);

      x = _mmxxx_srli_si(
          T::_mmxxx_add_epi(H_row[j], g),
          T::kRSS);

      if (type_ == AlignmentType::kSW) {
        H_row[j] = T::_mmxxx_max_epi(H_row[j], zeroes);
      }
      score = T::_mmxxx_max_epi(score, H_row[j]);
    }

    if (type_ == AlignmentType::kSW) {
      std::int32_t max_row_score = _mmxxx_max_value<A, T>(score);
      if (max_score < max_row_score) {
        max_score = max_row_score;
        max_i = i;
      }
    } else if (type_ == AlignmentType::kOV) {
      if (it->outedges.empty()) {
        std::int32_t max_row_score = _mmxxx_max_value<A, T>(score);
        if (max_score < max_row_score) {
          max_score = max_row_score;
          max_i = i;
        }
      }
    } else if (type_ == AlignmentType::kNW) {
      if (it->outedges.empty()) {
        std::int32_t max_row_score = _mmxxx_value_at<A, T>(
            H_row[matrix_width - 1],
            last_column_id);
        if (max_score < max_row_score) {
          max_score = max_row_score;
          max_i = i;
        }
      }
    }
  }

  if (max_i == -1 && max_j == -1) {
    return Alignment();
  }
  if (score) {
    *score = max_score;
  }

  if (type_ == AlignmentType::kSW) {
    max_j = _mmxxx_index_of<A, T>(
        &(pimpl_->H[max_i * matrix_width]),
        matrix_width,
        max_score);
  } else if (type_ == AlignmentType::kOV) {
    if (rank_to_node[max_i - 1]->outedges.empty()) {
      max_j = _mmxxx_index_of<A, T>(
          &(pimpl_->H[max_i * matrix_width]),
          matrix_width,
          max_score);
    } else {
      max_j = normal_matrix_width - 1;
    }
  } else if (type_ == AlignmentType::kNW) {
    max_j = normal_matrix_width - 1;
  }

  // backtrack
  std::uint32_t max_num_predecessors = 1;
  for (std::uint32_t i = 0; i < static_cast<std::uint32_t>(max_i); ++i) {
    max_num_predecessors = std::max(
        max_num_predecessors,
        static_cast<std::uint32_t>(rank_to_node[i]->inedges.size()));
  }

  std::vector<typename T::Storage> backtrack_storage(3 * T::kNumVar + 2 * T::kNumVar * max_num_predecessors);
  typename T::type* H = reinterpret_cast<typename T::type*>(backtrack_storage.data());
  typename T::type* H_pred = H + T::kNumVar;
  typename T::type* H_diag_pred = H_pred + T::kNumVar * max_num_predecessors;
  typename T::type* H_left_pred = H_diag_pred + T::kNumVar * max_num_predecessors;  // NOLINT
  typename T::type* profile = H_left_pred + T::kNumVar;

  std::vector<std::uint32_t> predecessors;

  std::int32_t i = max_i;
  std::int32_t j = max_j;
  std::int32_t prev_i = 0, prev_j = 0;

  std::uint32_t j_div = j / T::kNumVar;
  std::uint32_t j_mod = j % T::kNumVar;

  bool load_next_segment = true;

  Alignment alignment;

  do {
    // check stop condition
    if (j == -1 || i == 0) {
      break;
    }

    const auto& it = rank_to_node[i - 1];
    // load everything
    if (load_next_segment) {
      predecessors.clear();

      // load current cells
      _mmxxx_store_si(
          reinterpret_cast<__mxxxi*>(H),
          pimpl_->H[i * matrix_width + j_div]);

      // load predecessors cells
      if (it->inedges.empty()) {
        predecessors.emplace_back(0);
        _mmxxx_store_si(reinterpret_cast<__mxxxi*>(H_pred), pimpl_->H[j_div]);
      } else {
        std::uint32_t store_pos = 0;
        for (const auto& jt : it->inedges) {
          predecessors.emplace_back(pimpl_->node_id_to_rank[jt->tail->id] + 1);
          _mmxxx_store_si(
              reinterpret_cast<__mxxxi*>(&H_pred[store_pos * T::kNumVar]),
              pimpl_->H[predecessors.back() * matrix_width + j_div]);
          ++store_pos;
        }
      }

      // load query profile cells
      _mmxxx_store_si(
          reinterpret_cast<__mxxxi*>(profile),
          pimpl_->sequence_profile[it->code * matrix_width + j_div]);
    }

    // check stop condition
    if (type_ == AlignmentType::kSW && H[j_mod] == 0) {
      break;
    }

    if (j_mod == 0) {
      // border case
      if (j_div > 0) {
        _mmxxx_store_si(
            reinterpret_cast<__mxxxi*>(H_left_pred),
            pimpl_->H[i * matrix_width + j_div - 1]);

        for (std::uint32_t p = 0; p < predecessors.size(); ++p) {
          _mmxxx_store_si(
              reinterpret_cast<__mxxxi*>(&H_diag_pred[p * T::kNumVar]),
              pimpl_->H[predecessors[p] * matrix_width + (j_div - 1)]);
        }
      } else {
        H_left_pred[T::kNumVar - 1] = pimpl_->first_column[i];

        for (std::uint32_t p = 0; p < predecessors.size(); ++p) {
          H_diag_pred[(p + 1) * T::kNumVar - 1] =
              pimpl_->first_column[predecessors[p]];
        }
      }
    }

    // find best predecessor cell
    bool predecessor_found = false;

    if (i != 0) {
      for (std::uint32_t p = 0; p < predecessors.size(); ++p) {
        if ((j_mod == 0 && H[j_mod] == H_diag_pred[(p + 1) * T::kNumVar - 1] + profile[j_mod]) ||  // NOLINT
            (j_mod != 0 && H[j_mod] == H_pred[p * T::kNumVar + j_mod - 1] + profile[j_mod])) {  // NOLINT
          prev_i = predecessors[p];
          prev_j = j - 1;
          predecessor_found = true;
          break;
        }
      }
    }

    if (!predecessor_found && i != 0) {
      for (std::uint32_t p = 0; p < predecessors.size(); ++p) {
        if (H[j_mod] == H_pred[p * T::kNumVar + j_mod] + g_) {
          prev_i = predecessors[p];
          prev_j = j;
          predecessor_found = true;
          break;
        }
      }
    }

    if (!predecessor_found) {
      if ((j_mod == 0 && H[j_mod] == H_left_pred[T::kNumVar - 1] + g_) ||
          (j_mod != 0 && H[j_mod] == H[j_mod - 1] + g_)) {
        prev_i = i;
        prev_j = j - 1;
        predecessor_found = true;
      }
    }

    alignment.emplace_back(
        i == prev_i ? -1 : rank_to_node[i - 1]->id,
        j == prev_j ? -1 : j);

    // update for next round
    load_next_segment =
        (i == prev_i ? false : true) ||
        (j != prev_j && prev_j % T::kNumVar == T::kNumVar - 1 ? true : false);

    i = prev_i;
    j = prev_j;
    j_div = j / T::kNumVar;
    j_mod = j % T::kNumVar;
  } while (true);

  // update alignment for NW (backtrack stops on first row or column)
  if (type_ == AlignmentType::kNW) {
    while (i == 0 && j != -1) {
      alignment.emplace_back(-1, j);
      --j;
    }
    while (i != 0 && j == -1) {
      alignment.emplace_back(rank_to_node[i - 1]->id, -1);

      const auto& it = rank_to_node[i - 1];
      if (it->inedges.empty()) {
          i = 0;
      } else {
        for (const auto& jt : it->inedges) {
          std::uint32_t pred_i = pimpl_->node_id_to_rank[jt->tail->id] + 1;
          if (pimpl_->first_column[i] == pimpl_->first_column[pred_i] + g_) {
            i = pred_i;
            break;
          }
        }
      }
    }
  }

  std::reverse(alignment.begin(), alignment.end());
  return alignment;
#else
  (void) sequence_len;
  (void) graph;
  (void) score;
  return Alignment();
#endif
}